

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall xmrig::FailoverStrategy::~FailoverStrategy(FailoverStrategy *this)

{
  bool bVar1;
  iterator this_00;
  reference ppIVar2;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  *in_RDI;
  IClient *client;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *__range1;
  vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  local_18;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  *local_10;
  
  in_RDI->_M_current = (IClient **)&PTR__FailoverStrategy_002b73c0;
  in_RDI[1]._M_current = (IClient **)&DAT_002b7440;
  local_10 = in_RDI + 6;
  local_18._M_current =
       (IClient **)
       std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  this_00 = std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::end
                      (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
              ::operator*(&local_18);
    (*(*ppIVar2)->_vptr_IClient[0x13])();
    __gnu_cxx::
    __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::~vector
            ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)this_00._M_current);
  IClientListener::~IClientListener((IClientListener *)(in_RDI + 1));
  IStrategy::~IStrategy((IStrategy *)in_RDI);
  return;
}

Assistant:

xmrig::FailoverStrategy::~FailoverStrategy()
{
    for (IClient *client : m_pools) {
        client->deleteLater();
    }
}